

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O0

void skiwi::inline_ieee754_flround(asmcode *code,compiler_options *param_2)

{
  operand local_a8 [2];
  operation local_a0 [2];
  operand local_98 [2];
  operation local_90 [2];
  operand local_88;
  operation local_84 [2];
  operand local_7c [2];
  operation local_74;
  operand local_70 [2];
  operation local_68 [2];
  operand local_60 [2];
  operation local_58;
  operand local_54 [2];
  operation local_4c;
  uint64_t local_48;
  uint64_t header;
  operand local_38;
  operation local_34;
  unsigned_long local_30;
  operand local_24 [2];
  operation local_1c;
  compiler_options *local_18;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  local_1c = AND;
  local_24[1] = 9;
  local_24[0] = NUMBER;
  local_30 = 0xfffffffffffffff8;
  local_18 = param_2;
  param_1_local = (compiler_options *)code;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_1c,local_24 + 1,local_24,&local_30);
  local_34 = FLD;
  local_38 = MEM_RAX;
  header._4_4_ = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,&local_34,&local_38,(int *)((long)&header + 4));
  local_48 = make_block_header(1,T_FLONUM);
  local_4c = MOV;
  local_54[1] = 10;
  local_54[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_4c,local_54 + 1,local_54);
  local_58 = OR;
  local_60[1] = 10;
  local_60[0] = NUMBER;
  local_68[1] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,&local_58,local_60 + 1,local_60,(int *)(local_68 + 1));
  local_68[0] = MOV;
  local_70[1] = 9;
  local_70[0] = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            ((asmcode *)param_1_local,local_68,local_70 + 1,local_70,&local_48);
  local_74 = MOV;
  local_7c[1] = 0x20;
  local_7c[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_74,local_7c + 1,local_7c);
  local_84[1] = 0x1f;
  assembler::asmcode::add<assembler::asmcode::operation>((asmcode *)param_1_local,local_84 + 1);
  local_84[0] = FSTP;
  local_88 = MEM_RBP;
  local_90[1] = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,local_84,&local_88,(int *)(local_90 + 1));
  local_90[0] = ADD;
  local_98[1] = 0x10;
  local_98[0] = NUMBER;
  local_a0[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,local_90,local_98 + 1,local_98,(int *)(local_a0 + 1));
  local_a0[0] = MOV;
  local_a8[1] = 9;
  local_a8[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,local_a0,local_a8 + 1,local_a8);
  return;
}

Assistant:

void inline_ieee754_flround(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::FLD, ASM::asmcode::MEM_RAX, CELLS(1));

  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RBX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, header);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::FRNDINT);
  code.add(ASM::asmcode::FSTP, MEM_ALLOC, CELLS(1));
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::RBX);
  }